

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall MatroskaDemuxer::readTrackEncoding(MatroskaDemuxer *this,MatroskaTrack *track)

{
  int *levelUp;
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t id;
  uint32_t local_30;
  uint32_t local_2c;
  
  iVar1 = ebml_read_master(this,&local_2c);
  if (-1 < iVar1) {
    levelUp = &this->level_up;
    iVar1 = 0;
    do {
      iVar2 = ebml_read_element_id(this,&local_30,levelUp);
      if (iVar2 < 0) {
        return 0;
      }
      if (local_30 == 0) {
        return 0;
      }
      iVar2 = *levelUp;
      if (0 < iVar2) {
LAB_0019e3bb:
        *levelUp = iVar2 + -1;
        return 0;
      }
      if (local_30 == 0x5034) {
        iVar3 = readEncodingCompression(this,track);
      }
      else {
        iVar3 = ebml_read_skip(this);
      }
      iVar2 = *levelUp;
      if (iVar2 != 0) goto LAB_0019e3bb;
    } while (iVar3 == 0);
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::readTrackEncoding(MatroskaTrack *track)
{
    int res;
    uint32_t id;

    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            break;
        }
        if (level_up > 0)
        {
            level_up--;
            break;
        }

        res = id == MATROSKA_ID_ENCODINGCOMPRESSION ? readEncodingCompression(track) : ebml_read_skip();

        if (level_up)
        {
            level_up--;
            break;
        }
    }
    return 0;
}